

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LogFile.cc
# Opt level: O2

void __thiscall tt::LogFile::append_unlocked(LogFile *this,char *logline,int len)

{
  int iVar1;
  
  FileUtil::AppendFile::append
            ((this->m_file)._M_t.
             super___uniq_ptr_impl<tt::FileUtil::AppendFile,_std::default_delete<tt::FileUtil::AppendFile>_>
             ._M_t.
             super__Tuple_impl<0UL,_tt::FileUtil::AppendFile_*,_std::default_delete<tt::FileUtil::AppendFile>_>
             .super__Head_base<0UL,_tt::FileUtil::AppendFile_*,_false>._M_head_impl,logline,
             (long)len);
  iVar1 = this->m_count + 1;
  this->m_count = iVar1;
  if (iVar1 < this->m_flushEveryN) {
    return;
  }
  this->m_count = 0;
  FileUtil::AppendFile::flush
            ((this->m_file)._M_t.
             super___uniq_ptr_impl<tt::FileUtil::AppendFile,_std::default_delete<tt::FileUtil::AppendFile>_>
             ._M_t.
             super__Tuple_impl<0UL,_tt::FileUtil::AppendFile_*,_std::default_delete<tt::FileUtil::AppendFile>_>
             .super__Head_base<0UL,_tt::FileUtil::AppendFile_*,_false>._M_head_impl);
  return;
}

Assistant:

void tt::LogFile::append_unlocked(const char* logline, int len){
	m_file->append(logline, len);

	++m_count;
	if(m_count >= m_flushEveryN){
		m_count = 0;
		m_file->flush();
	}
}